

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

void adiak_fini(void)

{
  int iVar1;
  adiak_value_t val;
  long local_28;
  long local_20;
  long local_18;
  timeval etime;
  
  if (measure_adiak_cputime == '\x01') {
    iVar1 = adksys_get_times((timeval *)0x0,(timeval *)&val);
    if (iVar1 != -1) {
      adiak_namevalue("cputime",3,"timing","%t",&val);
    }
  }
  if (measure_adiak_systime == '\x01') {
    iVar1 = adksys_get_times((timeval *)&val,(timeval *)0x0);
    if (iVar1 != -1) {
      adiak_namevalue("systime",3,"timing","%t",&val);
    }
  }
  if (measure_adiak_walltime == '\x01') {
    iVar1 = adksys_starttime((timeval *)&val);
    if (iVar1 != -1) {
      iVar1 = adksys_curtime(&etime);
      if (iVar1 != -1) {
        local_20 = etime.tv_sec - CONCAT44(val.v_long._4_4_,val.v_int);
        if (etime.tv_usec < local_28) {
          etime.tv_usec = etime.tv_usec + 1000000;
          local_20 = local_20 + -1;
        }
        local_18 = etime.tv_usec - local_28;
        adiak_namevalue("walltime",3,"timing","%t");
      }
    }
  }
  val.v_int = 0;
  adiak_raw_namevalue("fini",4,(char *)0x0,&val,&base_int);
  return;
}

Assistant:

void adiak_fini()
{
   adiak_value_t val;
   if (measure_adiak_cputime)
      measure_cputime();
   if (measure_adiak_systime)
      measure_systime();
   if (measure_adiak_walltime)
      measure_walltime();

   val.v_int = 0;
   adiak_raw_namevalue("fini", adiak_control, NULL, &val, &base_int);
}